

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O3

Compressed_lower_distance_matrix *
read_upper_distance_matrix
          (Compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  istream *piVar1;
  value_t value;
  vector<float,_std::allocator<float>_> distances;
  float local_6c;
  vector<float,_std::allocator<float>_> local_68;
  Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)1> local_50;
  
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  while( true ) {
    piVar1 = std::istream::_M_extract<float>((float *)input_stream);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)&local_68,
                 (iterator)
                 local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_6c);
    }
    else {
      *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_6c;
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::istream::ignore();
  }
  Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)1>::
  Compressed_distance_matrix(&local_50,&local_68);
  Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>::
  Compressed_distance_matrix<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)1>>
            ((Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0> *)
             __return_storage_ptr__,&local_50);
  if (local_50.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.distances.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.distances.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Compressed_lower_distance_matrix read_upper_distance_matrix(std::istream& input_stream) {
  std::vector<value_t> distances;
  value_t value;
  while (input_stream >> value) {
    distances.push_back(value);
    input_stream.ignore();
  }

  return Compressed_lower_distance_matrix(Compressed_upper_distance_matrix(std::move(distances)));
}